

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O1

void __thiscall amrex::MLABecLaplacian::applyRobinBCTermsCoeffs(MLABecLaplacian *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  FabArray<amrex::FArrayBox> *this_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  IntVect hi;
  IntVect low;
  Real fac;
  Real fac_1;
  MFItInfo mfi_info;
  MFIter mfi;
  long local_370;
  bool local_364;
  long local_360;
  long local_358;
  int local_328 [4];
  int local_318 [4];
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  int local_2e8;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  ulong local_2a0;
  ulong local_298;
  ulong local_290;
  ulong local_288;
  long local_280;
  uint local_274;
  Array4<const_double> local_270;
  Array4<double> local_230;
  long local_1f0;
  ulong local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  int local_1b0;
  uint local_1ac;
  int local_1a8;
  int local_1a4;
  long local_1a0;
  double local_198;
  double local_190;
  double local_188;
  MLABecLaplacian *local_180;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  MFItInfo local_13c;
  double local_128;
  double local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  ulong local_f8;
  LinOpBCType *local_f0;
  LinOpBCType *local_e8;
  long local_e0;
  long local_d0;
  long local_c8;
  long local_c0;
  ulong local_b8;
  uint local_b0;
  Box local_ac;
  MFIter local_90;
  
  bVar9 = MLLinOp::hasRobinBC((MLLinOp *)this);
  if (bVar9) {
    local_274 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])
                          (this);
    local_120 = this->m_a_scalar;
    if ((local_120 == 0.0) && (!NAN(local_120))) {
      this->m_a_scalar = 1.0;
    }
    if (0 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels) {
      local_128 = this->m_b_scalar / this->m_a_scalar;
      local_f8 = (ulong)local_274;
      lVar15 = 0;
      local_180 = this;
      do {
        lVar31 = lVar15 * 3;
        lVar26 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                           super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar15].
                           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
        local_158 = *(double *)(lVar26 + 0x38);
        dStack_150 = 0.0;
        local_168 = *(double *)(lVar26 + 0x40);
        dStack_160 = 0.0;
        local_178 = *(double *)(lVar26 + 0x48);
        dStack_170 = 0.0;
        local_1a0 = lVar15;
        if ((local_120 == 0.0) && (!NAN(local_120))) {
          this_00 = *(FabArray<amrex::FArrayBox> **)
                     &(this->m_a_coeffs).
                      super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                      .
                      super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar15].
                      super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                      super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
          FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    (this_00,0.0,0,(this_00->super_FabArrayBase).n_comp,
                     &(this_00->super_FabArrayBase).n_grow);
        }
        local_13c.do_tiling = false;
        local_13c.num_streams = Gpu::Device::max_gpu_streams;
        local_13c.tilesize.vect[0] = 0;
        local_13c.tilesize.vect[1] = 0;
        local_13c.tilesize.vect[2] = 0;
        local_13c.dynamic = true;
        local_13c.device_sync = true;
        MFIter::MFIter(&local_90,
                       *(FabArrayBase **)
                        &(this->m_a_coeffs).
                         super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar15].
                         super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,
                       &local_13c);
        if (local_90.currentIndex < local_90.endIndex) {
          local_188 = local_128 * local_168 * local_168;
          local_190 = local_128 * local_158 * local_158;
          local_198 = local_128 * local_178 * local_178;
          dStack_160 = local_168;
          dStack_150 = local_158;
          dStack_170 = local_178;
          local_118 = lVar26;
          local_110 = lVar31;
          do {
            BATransformer::operator()
                      (&local_ac,&((local_90.fabArray)->boxarray).m_bat,
                       (Box *)((long)((local_90.index_map)->super_vector<int,_std::allocator<int>_>)
                                     .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[local_90.currentIndex] * 0x1c
                              + *(long *)&((((local_90.fabArray)->boxarray).m_ref.
                                            super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->m_abox).
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data));
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_230,
                       &(&(((this->m_a_coeffs).
                            super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>).
                          super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                          _M_impl.super__Vector_impl_data._M_start)[lVar31]->
                        super_FabArray<amrex::FArrayBox>,&local_90);
            lVar15 = lVar26;
            lVar11 = 0;
            do {
              lVar28 = lVar11;
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_270,
                         &(&(((this->m_b_coeffs).
                              super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                            ).
                            super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)[lVar31]->_M_elems[lVar28].
                          super_FabArray<amrex::FArrayBox>,&local_90);
              lVar31 = local_110;
              lVar26 = local_118;
              this = local_180;
              local_318[2] = local_ac.smallend.vect[2];
              local_318[0] = local_ac.smallend.vect[0];
              local_318[1] = local_ac.smallend.vect[1];
              local_328[2] = local_ac.bigend.vect[2];
              local_328[0] = local_ac.bigend.vect[0];
              local_328[1] = local_ac.bigend.vect[1];
              iVar3 = local_318[lVar28];
              local_318[lVar28] = iVar3 + -1;
              iVar8 = local_318[2];
              local_328[lVar28] = iVar3 + -1;
              iVar5 = local_328[2];
              iVar6 = local_318[0];
              local_1e0 = (long)local_318[0];
              iVar7 = local_318[1];
              lVar20 = (long)local_318[1];
              lVar14 = (long)local_318[2];
              iVar3 = local_328[0];
              iVar4 = local_328[1];
              local_288 = (ulong)(uint)local_328[1];
              local_298 = (ulong)(uint)local_328[2];
              local_318[2] = local_ac.smallend.vect[2];
              local_318[0] = local_ac.smallend.vect[0];
              local_318[1] = local_ac.smallend.vect[1];
              local_328[2] = local_ac.bigend.vect[2];
              local_328[0] = local_ac.bigend.vect[0];
              local_328[1] = local_ac.bigend.vect[1];
              local_b8 = CONCAT44(local_ac.btype.itype >> 1,local_ac.btype.itype) & 0x100000001;
              local_b0 = local_ac.btype.itype >> 2 & 1;
              iVar10 = (~*(uint *)((long)&local_b8 + lVar28 * 4) & 1) + local_328[lVar28];
              local_318[lVar28] = iVar10;
              local_328[lVar28] = iVar10;
              local_280 = (long)local_318[0];
              lVar11 = (long)local_318[1];
              lVar12 = (long)local_318[2];
              local_290 = (ulong)(uint)local_328[1];
              local_2a0 = (ulong)(uint)local_328[2];
              if (iVar6 < *(int *)(lVar15 + 0xac)) {
                local_364 = false;
              }
              else if ((((iVar7 < *(int *)(lVar15 + 0xb0)) || (iVar8 < *(int *)(lVar15 + 0xb4))) ||
                       (*(int *)(lVar15 + 0xb8) < iVar3)) || (*(int *)(lVar15 + 0xbc) < iVar4)) {
                local_364 = false;
              }
              else {
                local_364 = iVar5 <= *(int *)(lVar15 + 0xc0);
              }
              if (((local_318[0] < *(int *)(lVar15 + 0xac)) ||
                  (local_318[1] < *(int *)(lVar15 + 0xb0))) ||
                 ((local_318[2] < *(int *)(lVar15 + 0xb4) ||
                  ((*(int *)(lVar15 + 0xb8) < local_328[0] ||
                   (*(int *)(lVar15 + 0xbc) < local_328[1])))))) {
                local_1ac = 0;
              }
              else {
                local_1ac = (uint)(local_328[2] <= *(int *)(lVar15 + 0xc0));
              }
              if ((local_364 & (byte)local_1ac) == 0 && 0 < (int)local_274) {
                local_e0 = *(long *)((long)(local_180->super_MLCellABecLap).super_MLCellLinOp.
                                           m_robin_bcval.
                                           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                           .
                                           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[local_1a0]._M_t
                                           .
                                           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                    + 0x108);
                local_f0 = ((local_180->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.
                            m_lobc_orig.
                            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            .
                            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar28;
                local_e8 = ((local_180->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.
                            m_hibc_orig.
                            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            .
                            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar28;
                local_2dc = iVar4 + 1;
                local_2e4 = iVar5 + 1;
                local_2e0 = local_328[1] + 1;
                local_2e8 = local_328[2] + 1;
                local_2a8 = local_1e0 * 8;
                local_d0 = lVar20 + 1;
                local_1c0 = lVar20 * 8;
                local_1c8 = lVar14 * 8;
                iVar30 = (iVar3 - iVar6) + 1;
                iVar10 = (local_328[0] - local_318[0]) + 1;
                local_100 = (long)local_90.currentIndex * 4;
                local_108 = lVar14 + 1;
                local_2b0 = local_280 * 8;
                local_1d0 = lVar11 * 8;
                local_1d8 = lVar12 * 8;
                local_1a4 = local_318[1] + -1;
                local_1a8 = local_318[0] + -1;
                local_1b0 = local_318[2] + -1;
                local_300 = 8;
                local_308 = 0;
                local_2f0 = 0;
                local_1e8 = 0;
                do {
                  piVar13 = &local_90.currentIndex;
                  if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                    piVar13 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + local_90.currentIndex;
                  }
                  lVar15 = *(long *)(local_e0 + (long)*piVar13 * 8);
                  local_2b8 = *(long *)(lVar15 + 0x10);
                  local_2c0 = (long)*(int *)(lVar15 + 0x18);
                  local_2c8 = (long)*(int *)(lVar15 + 0x1c);
                  local_2d8 = (long)*(int *)(lVar15 + 0x20);
                  lVar27 = (long)((*(int *)(lVar15 + 0x24) - *(int *)(lVar15 + 0x18)) + 1);
                  local_2d0 = (long)((*(int *)(lVar15 + 0x28) - *(int *)(lVar15 + 0x1c)) + 1);
                  lVar15 = (long)((*(int *)(lVar15 + 0x2c) - *(int *)(lVar15 + 0x20)) + 1);
                  local_c8 = local_1e8 * 3;
                  iVar19 = (int)lVar28;
                  if (local_f0[local_1e8 * 3] == Robin && local_364 == false) {
                    if (iVar19 == 1) {
                      if (iVar8 <= iVar5) {
                        lVar23 = ((local_300 * lVar15 + local_1c8 + local_2d8 * -8) * local_2d0 +
                                  local_1c0 + local_2c8 * -8) * lVar27 + local_2c0 * -8 +
                                 local_2a8 + local_2b8;
                        lVar17 = local_2d0 * lVar27 * 8;
                        lVar32 = ((local_308 * lVar15 + local_1c8 + local_2d8 * -8) * local_2d0 +
                                  local_1c0 + local_2c8 * -8) * lVar27 + local_2c0 * -8 +
                                 local_2a8 + local_2b8;
                        lVar29 = lVar14;
                        do {
                          if (iVar7 <= iVar4) {
                            local_2f8 = (long)local_230.begin.y;
                            lVar25 = (long)local_270.p +
                                     local_270.nstride * local_2f0 +
                                     (local_d0 - local_270.begin.y) * local_270.jstride * 8 +
                                     (lVar29 - local_270.begin.z) * local_270.kstride * 8 +
                                     (long)local_270.begin.x * -8 + local_2a8;
                            lVar18 = (long)local_230.p +
                                     local_230.nstride * local_2f0 +
                                     (local_d0 - local_2f8) * local_230.jstride * 8 +
                                     (lVar29 - local_230.begin.z) * local_230.kstride * 8 +
                                     (long)local_230.begin.x * -8 + local_2a8;
                            lVar16 = lVar20;
                            lVar24 = lVar32;
                            lVar21 = lVar23;
                            do {
                              if (iVar6 <= iVar3) {
                                lVar22 = 0;
                                do {
                                  dVar1 = *(double *)(lVar24 + lVar22 * 8);
                                  dVar2 = *(double *)(lVar21 + lVar22 * 8);
                                  *(double *)(lVar18 + lVar22 * 8) =
                                       (1.0 - (dVar2 * local_168 + dVar1 * -0.5) /
                                              (dVar2 * dStack_160 + dVar1 * 0.5)) *
                                       *(double *)(lVar25 + lVar22 * 8) * local_188 +
                                       *(double *)(lVar18 + lVar22 * 8);
                                  lVar22 = lVar22 + 1;
                                } while (iVar30 != (int)lVar22);
                              }
                              lVar16 = lVar16 + 1;
                              lVar25 = lVar25 + local_270.jstride * 8;
                              lVar21 = lVar21 + lVar27 * 8;
                              lVar24 = lVar24 + lVar27 * 8;
                              lVar18 = lVar18 + local_230.jstride * 8;
                            } while (local_2dc != (int)lVar16);
                          }
                          lVar29 = lVar29 + 1;
                          lVar23 = lVar23 + lVar17;
                          lVar32 = lVar32 + lVar17;
                        } while (local_2e4 != (int)lVar29);
                      }
                    }
                    else if (iVar19 == 0) {
                      if (iVar8 <= iVar5) {
                        lVar32 = ((local_300 * lVar15 + local_1c8 + local_2d8 * -8) * local_2d0 +
                                  local_1c0 + local_2c8 * -8) * lVar27 + local_2c0 * -8 +
                                 local_2a8 + local_2b8;
                        lVar23 = local_2d0 * lVar27 * 8;
                        lVar17 = ((local_308 * lVar15 + local_1c8 + local_2d8 * -8) * local_2d0 +
                                  local_1c0 + local_2c8 * -8) * lVar27 + local_2c0 * -8 +
                                 local_2a8 + local_2b8;
                        lVar29 = lVar14;
                        do {
                          if (iVar7 <= iVar4) {
                            local_1b8 = (long)local_270.begin.y;
                            lVar18 = (long)local_230.p +
                                     local_230.nstride * local_2f0 +
                                     (lVar20 - local_230.begin.y) * local_230.jstride * 8 +
                                     (lVar29 - local_230.begin.z) * local_230.kstride * 8 +
                                     (long)local_230.begin.x * -8 + local_2a8 + 8;
                            lVar25 = (long)local_270.p +
                                     local_270.nstride * local_2f0 +
                                     (lVar29 - local_270.begin.z) * local_270.kstride * 8 +
                                     (lVar20 - local_1b8) * local_270.jstride * 8 +
                                     (long)local_270.begin.x * -8 + local_2a8 + 8;
                            lVar16 = lVar20;
                            lVar24 = lVar17;
                            lVar21 = lVar32;
                            do {
                              if (iVar6 <= iVar3) {
                                lVar22 = 0;
                                do {
                                  dVar1 = *(double *)(lVar24 + lVar22 * 8);
                                  dVar2 = *(double *)(lVar21 + lVar22 * 8);
                                  *(double *)(lVar18 + lVar22 * 8) =
                                       (1.0 - (dVar2 * local_158 + dVar1 * -0.5) /
                                              (dVar2 * dStack_150 + dVar1 * 0.5)) *
                                       *(double *)(lVar25 + lVar22 * 8) * local_190 +
                                       *(double *)(lVar18 + lVar22 * 8);
                                  lVar22 = lVar22 + 1;
                                } while (iVar30 != (int)lVar22);
                              }
                              lVar16 = lVar16 + 1;
                              lVar21 = lVar21 + lVar27 * 8;
                              lVar24 = lVar24 + lVar27 * 8;
                              lVar18 = lVar18 + local_230.jstride * 8;
                              lVar25 = lVar25 + local_270.jstride * 8;
                              local_2f8 = lVar32;
                            } while (local_2dc != (int)lVar16);
                          }
                          lVar29 = lVar29 + 1;
                          lVar32 = lVar32 + lVar23;
                          lVar17 = lVar17 + lVar23;
                        } while (local_2e4 != (int)lVar29);
                      }
                    }
                    else if (iVar8 <= iVar5) {
                      lVar23 = ((local_300 * lVar15 + local_1c8 + local_2d8 * -8) * local_2d0 +
                                local_1c0 + local_2c8 * -8) * lVar27 + local_2c0 * -8 +
                               local_2a8 + local_2b8;
                      lVar17 = local_2d0 * lVar27 * 8;
                      local_370 = ((local_308 * lVar15 + local_1c8 + local_2d8 * -8) * local_2d0 +
                                   local_1c0 + local_2c8 * -8) * lVar27 + local_2c0 * -8 +
                                  local_2a8 + local_2b8;
                      lVar29 = lVar14;
                      lVar32 = local_108;
                      do {
                        if (iVar7 <= iVar4) {
                          local_2f8 = (long)local_230.begin.x;
                          local_c0 = (long)local_230.begin.y;
                          lVar18 = (long)local_270.p +
                                   local_270.nstride * local_2f0 +
                                   (lVar20 - local_270.begin.y) * local_270.jstride * 8 +
                                   (lVar32 - local_270.begin.z) * local_270.kstride * 8 +
                                   (long)local_270.begin.x * -8 + local_2a8;
                          lVar25 = (long)local_230.p +
                                   local_230.nstride * local_2f0 +
                                   (lVar32 - local_230.begin.z) * local_230.kstride * 8 +
                                   (lVar20 - local_c0) * local_230.jstride * 8 + local_2f8 * -8 +
                                   local_2a8;
                          lVar16 = lVar20;
                          lVar24 = local_370;
                          lVar21 = lVar23;
                          do {
                            if (iVar6 <= iVar3) {
                              lVar22 = 0;
                              do {
                                dVar1 = *(double *)(lVar24 + lVar22 * 8);
                                dVar2 = *(double *)(lVar21 + lVar22 * 8);
                                *(double *)(lVar25 + lVar22 * 8) =
                                     (1.0 - (dVar2 * local_178 + dVar1 * -0.5) /
                                            (dVar2 * dStack_170 + dVar1 * 0.5)) *
                                     *(double *)(lVar18 + lVar22 * 8) * local_198 +
                                     *(double *)(lVar25 + lVar22 * 8);
                                lVar22 = lVar22 + 1;
                              } while (iVar30 != (int)lVar22);
                            }
                            lVar16 = lVar16 + 1;
                            lVar18 = lVar18 + local_270.jstride * 8;
                            lVar21 = lVar21 + lVar27 * 8;
                            lVar24 = lVar24 + lVar27 * 8;
                            lVar25 = lVar25 + local_230.jstride * 8;
                            local_1b8 = lVar23;
                          } while (local_2dc != (int)lVar16);
                        }
                        lVar29 = lVar29 + 1;
                        lVar32 = lVar32 + 1;
                        lVar23 = lVar23 + lVar17;
                        local_370 = local_370 + lVar17;
                      } while (local_2e4 != (int)lVar29);
                    }
                  }
                  if (local_e8[local_1e8 * 3] == Robin && (byte)local_1ac == 0) {
                    if (iVar19 == 1) {
                      if (local_318[2] <= local_328[2]) {
                        local_370 = ((local_300 * lVar15 + local_1d8 + local_2d8 * -8) * local_2d0 +
                                     local_1d0 + local_2c8 * -8) * lVar27 + local_2c0 * -8 +
                                    local_2b8 + local_2b0;
                        lVar29 = local_2d0 * lVar27 * 8;
                        lVar32 = ((lVar15 * local_308 + local_1d8 + local_2d8 * -8) * local_2d0 +
                                  local_1d0 + local_2c8 * -8) * lVar27 + local_2c0 * -8 +
                                 local_2b8 + local_2b0;
                        lVar15 = lVar12;
                        do {
                          if (local_318[1] <= local_328[1]) {
                            lVar24 = (long)local_270.p +
                                     local_270.nstride * local_2f0 +
                                     (lVar11 - local_270.begin.y) * local_270.jstride * 8 +
                                     (lVar15 - local_270.begin.z) * local_270.kstride * 8 +
                                     (long)local_270.begin.x * -8 + local_2b0;
                            iVar19 = local_1a4 - local_230.begin.y;
                            lVar17 = lVar11;
                            lVar23 = lVar32;
                            lVar16 = local_370;
                            do {
                              if (local_318[0] <= local_328[0]) {
                                lVar21 = (long)iVar19 * local_230.jstride * 8 +
                                         local_230.nstride * local_2f0 +
                                         (lVar15 - local_230.begin.z) * local_230.kstride * 8 +
                                         (long)local_230.begin.x * -8 + local_2b0;
                                lVar18 = 0;
                                do {
                                  dVar1 = *(double *)(lVar23 + lVar18 * 8);
                                  dVar2 = *(double *)(lVar16 + lVar18 * 8);
                                  *(double *)((long)local_230.p + lVar18 * 8 + lVar21) =
                                       (1.0 - (dVar2 * local_168 + dVar1 * -0.5) /
                                              (dVar2 * dStack_160 + dVar1 * 0.5)) *
                                       *(double *)(lVar24 + lVar18 * 8) * local_188 +
                                       *(double *)((long)local_230.p + lVar18 * 8 + lVar21);
                                  lVar18 = lVar18 + 1;
                                } while (iVar10 != (int)lVar18);
                              }
                              lVar17 = lVar17 + 1;
                              lVar24 = lVar24 + local_270.jstride * 8;
                              lVar16 = lVar16 + lVar27 * 8;
                              lVar23 = lVar23 + lVar27 * 8;
                              iVar19 = iVar19 + 1;
                            } while (local_2e0 != (int)lVar17);
                          }
                          lVar15 = lVar15 + 1;
                          local_370 = local_370 + lVar29;
                          lVar32 = lVar32 + lVar29;
                        } while (local_2e8 != (int)lVar15);
                      }
                    }
                    else if (iVar19 == 0) {
                      if (local_318[2] <= local_328[2]) {
                        local_360 = ((local_300 * lVar15 + local_1d8 + local_2d8 * -8) * local_2d0 +
                                     local_1d0 + local_2c8 * -8) * lVar27 + local_2c0 * -8 +
                                    local_2b8 + local_2b0;
                        local_2f8 = local_2d0 * lVar27 * 8;
                        local_358 = ((lVar15 * local_308 + local_1d8 + local_2d8 * -8) * local_2d0 +
                                     local_1d0 + local_2c8 * -8) * lVar27 + local_2c0 * -8 +
                                    local_2b8 + local_2b0;
                        local_370 = lVar12;
                        do {
                          if (local_318[1] <= local_328[1]) {
                            lVar23 = (local_370 - local_230.begin.z) * local_230.kstride;
                            lVar17 = (long)local_270.p +
                                     local_270.nstride * local_2f0 +
                                     (lVar11 - local_270.begin.y) * local_270.jstride * 8 +
                                     (local_370 - local_270.begin.z) * local_270.kstride * 8 +
                                     (long)local_270.begin.x * -8 + local_2b0;
                            lVar15 = local_358;
                            lVar29 = lVar11;
                            lVar32 = local_360;
                            do {
                              if (local_318[0] <= local_328[0]) {
                                lVar16 = (lVar29 - local_230.begin.y) * local_230.jstride;
                                lVar24 = 0;
                                do {
                                  dVar1 = *(double *)(lVar15 + lVar24 * 8);
                                  dVar2 = *(double *)(lVar32 + lVar24 * 8);
                                  lVar21 = (long)((local_1a8 - local_230.begin.x) + (int)lVar24);
                                  local_230.p
                                  [lVar23 + local_230.nstride * local_1e8 + lVar16 + lVar21] =
                                       (1.0 - (dVar2 * local_158 + dVar1 * -0.5) /
                                              (dVar2 * dStack_150 + dVar1 * 0.5)) *
                                       *(double *)(lVar17 + lVar24 * 8) * local_190 +
                                       local_230.p
                                       [lVar23 + local_230.nstride * local_1e8 + lVar16 + lVar21];
                                  lVar24 = lVar24 + 1;
                                } while (iVar10 != (int)lVar24);
                              }
                              lVar29 = lVar29 + 1;
                              lVar17 = lVar17 + local_270.jstride * 8;
                              lVar32 = lVar32 + lVar27 * 8;
                              lVar15 = lVar15 + lVar27 * 8;
                            } while (local_2e0 != (int)lVar29);
                          }
                          local_370 = local_370 + 1;
                          local_360 = local_360 + local_2f8;
                          local_358 = local_358 + local_2f8;
                        } while (local_2e8 != (int)local_370);
                      }
                    }
                    else if (local_318[2] <= local_328[2]) {
                      lVar29 = ((local_300 * lVar15 + local_1d8 + local_2d8 * -8) * local_2d0 +
                                local_1d0 + local_2c8 * -8) * lVar27 + local_2c0 * -8 +
                               local_2b8 + local_2b0;
                      lVar32 = local_2d0 * lVar27 * 8;
                      lVar17 = ((lVar15 * local_308 + local_1d8 + local_2d8 * -8) * local_2d0 +
                                local_1d0 + local_2c8 * -8) * lVar27 + local_2c0 * -8 +
                               local_2b8 + local_2b0;
                      lVar15 = lVar12;
                      iVar19 = local_1b0;
                      do {
                        if (local_318[1] <= local_328[1]) {
                          lVar18 = (long)local_270.p +
                                   local_270.nstride * local_2f0 +
                                   (lVar11 - local_270.begin.y) * local_270.jstride * 8 +
                                   (lVar15 - local_270.begin.z) * local_270.kstride * 8 +
                                   (long)local_270.begin.x * -8 + local_2b0;
                          lVar21 = (long)local_230.p +
                                   local_230.nstride * local_2f0 +
                                   (lVar11 - local_230.begin.y) * local_230.jstride * 8 +
                                   (iVar19 - local_230.begin.z) * local_230.kstride * 8 +
                                   (long)local_230.begin.x * -8 + local_2b0;
                          lVar23 = lVar11;
                          lVar16 = lVar17;
                          lVar24 = lVar29;
                          do {
                            if (local_318[0] <= local_328[0]) {
                              lVar25 = 0;
                              do {
                                dVar1 = *(double *)(lVar16 + lVar25 * 8);
                                dVar2 = *(double *)(lVar24 + lVar25 * 8);
                                *(double *)(lVar21 + lVar25 * 8) =
                                     (1.0 - (dVar2 * local_178 + dVar1 * -0.5) /
                                            (dVar2 * dStack_170 + dVar1 * 0.5)) *
                                     *(double *)(lVar18 + lVar25 * 8) * local_198 +
                                     *(double *)(lVar21 + lVar25 * 8);
                                lVar25 = lVar25 + 1;
                              } while (iVar10 != (int)lVar25);
                            }
                            lVar23 = lVar23 + 1;
                            lVar18 = lVar18 + local_270.jstride * 8;
                            lVar24 = lVar24 + lVar27 * 8;
                            lVar16 = lVar16 + lVar27 * 8;
                            lVar21 = lVar21 + local_230.jstride * 8;
                          } while (local_2e0 != (int)lVar23);
                        }
                        lVar15 = lVar15 + 1;
                        lVar29 = lVar29 + lVar32;
                        lVar17 = lVar17 + lVar32;
                        iVar19 = iVar19 + 1;
                      } while (local_2e8 != (int)lVar15);
                    }
                  }
                  local_1e8 = local_1e8 + 1;
                  local_2f0 = local_2f0 + 8;
                  local_300 = local_300 + 0x18;
                  local_308 = local_308 + 0x18;
                } while (local_1e8 != local_f8);
              }
              lVar15 = local_118;
              lVar11 = lVar28 + 1;
              local_1f0 = lVar28;
            } while (lVar28 + 1 != 3);
            MFIter::operator++(&local_90);
          } while (local_90.currentIndex < local_90.endIndex);
        }
        MFIter::~MFIter(&local_90);
        lVar15 = local_1a0 + 1;
      } while (lVar15 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels
              );
    }
  }
  return;
}

Assistant:

void
MLABecLaplacian::applyRobinBCTermsCoeffs ()
{
    if (!hasRobinBC()) return;

    const int ncomp = getNComp();
    bool reset_alpha = false;
    if (m_a_scalar == Real(0.0)) {
        m_a_scalar = Real(1.0);
        reset_alpha = true;
    }
    const Real bovera = m_b_scalar/m_a_scalar;

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        const int mglev = 0;
        const Box& domain = m_geom[amrlev][mglev].Domain();
        const Real dxi = m_geom[amrlev][mglev].InvCellSize(0);
        const Real dyi = (AMREX_SPACEDIM >= 2) ? m_geom[amrlev][mglev].InvCellSize(1) : Real(1.0);
        const Real dzi = (AMREX_SPACEDIM == 3) ? m_geom[amrlev][mglev].InvCellSize(2) : Real(1.0);

        if (reset_alpha) {
            m_a_coeffs[amrlev][mglev].setVal(0.0);
        }

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(m_a_coeffs[amrlev][mglev], mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& vbx = mfi.validbox();
            Array4<Real> const& afab = m_a_coeffs[amrlev][mglev].array(mfi);
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                Array4<Real const> const& bfab = m_b_coeffs[amrlev][mglev][idim].const_array(mfi);
                const Box& blo = amrex::adjCellLo(vbx,idim);
                const Box& bhi = amrex::adjCellHi(vbx,idim);
                bool outside_domain_lo = !(domain.contains(blo));
                bool outside_domain_hi = !(domain.contains(bhi));
                if ((!outside_domain_lo) && (!outside_domain_hi)) continue;
                for (int icomp = 0; icomp < ncomp; ++icomp) {
                    Array4<Real const> const& rbc = (*m_robin_bcval[amrlev])[mfi].const_array(icomp*3);
                    if (m_lobc_orig[icomp][idim] == LinOpBCType::Robin && outside_domain_lo)
                    {
                        if (idim == 0) {
                            Real fac = bovera*dxi*dxi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dxi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dxi + rbc(i,j,k,0)*Real(0.5));
                                afab(i+1,j,k,icomp) += fac*bfab(i+1,j,k,icomp)*(Real(1.0)-B);
                            });
                        } else if (idim == 1) {
                            Real fac = bovera*dyi*dyi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dyi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dyi + rbc(i,j,k,0)*Real(0.5));
                                afab(i,j+1,k,icomp) += fac*bfab(i,j+1,k,icomp)*(Real(1.0)-B);
                            });
                        } else {
                            Real fac = bovera*dzi*dzi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dzi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dzi + rbc(i,j,k,0)*Real(0.5));
                                afab(i,j,k+1,icomp) += fac*bfab(i,j,k+1,icomp)*(Real(1.0)-B);
                            });
                        }
                    }
                    if (m_hibc_orig[icomp][idim] == LinOpBCType::Robin && outside_domain_hi)
                    {
                        if (idim == 0) {
                            Real fac = bovera*dxi*dxi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dxi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dxi + rbc(i,j,k,0)*Real(0.5));
                                afab(i-1,j,k,icomp) += fac*bfab(i,j,k,icomp)*(Real(1.0)-B);
                            });
                        } else if (idim == 1) {
                            Real fac = bovera*dyi*dyi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dyi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dyi + rbc(i,j,k,0)*Real(0.5));
                                afab(i,j-1,k,icomp) += fac*bfab(i,j,k,icomp)*(Real(1.0)-B);
                            });
                        } else {
                            Real fac = bovera*dzi*dzi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dzi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dzi + rbc(i,j,k,0)*Real(0.5));
                                afab(i,j,k-1,icomp) += fac*bfab(i,j,k,icomp)*(Real(1.0)-B);
                            });
                        }
                    }
                }
            }
        }
    }
}